

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boxbp.cpp
# Opt level: O2

void __thiscall libDAI::BoxBP::run(BoxBP *this,FactorGraph *fg,size_t maxiter)

{
  int iVar1;
  undefined4 extraout_var;
  pointer ppVar2;
  pointer ppVar3;
  size_t iter;
  ulong uVar4;
  size_t sVar5;
  long lVar6;
  ulong __n;
  size_t t;
  vector<unsigned_long,_std::allocator<unsigned_long>_> edge_seq;
  VarSet local_a8;
  Box local_88;
  
  std::vector<libDAI::Box,_std::allocator<libDAI::Box>_>::clear
            ((vector<libDAI::Box,_std::allocator<libDAI::Box>_> *)this);
  std::vector<libDAI::Box,_std::allocator<libDAI::Box>_>::reserve
            ((vector<libDAI::Box,_std::allocator<libDAI::Box>_> *)this,
             (long)(fg->_fg)._E12.
                   super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(fg->_fg)._E12.
                   super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 4);
  lVar6 = 0;
  uVar4 = 0;
  while( true ) {
    ppVar2 = (fg->_fg)._E12.
             super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    __n = (long)(fg->_fg)._E12.
                super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                ._M_impl.super__Vector_impl_data._M_finish - (long)ppVar2 >> 4;
    if (__n <= uVar4) break;
    iVar1 = (*(fg->super_GraphicalModel)._vptr_GraphicalModel[6])
                      (fg,*(undefined8 *)((long)&ppVar2->first + lVar6));
    VarSet::VarSet(&local_a8,(Var *)CONCAT44(extraout_var,iVar1));
    Box::Box(&local_88,&local_a8);
    std::vector<libDAI::Box,_std::allocator<libDAI::Box>_>::emplace_back<libDAI::Box>
              ((vector<libDAI::Box,_std::allocator<libDAI::Box>_> *)this,&local_88);
    Box::~Box(&local_88);
    std::_Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>::~_Vector_base
              ((_Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_> *)&local_a8);
    uVar4 = uVar4 + 1;
    lVar6 = lVar6 + 0x10;
  }
  local_88._vars._vars.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_88._vars._vars.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_88._vars._vars.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::reserve
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_88,__n);
  local_a8._vars.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  while( true ) {
    ppVar3 = (fg->_fg)._E12.
             super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    ppVar2 = (fg->_fg)._E12.
             super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((pointer)((long)ppVar3 - (long)ppVar2 >> 4) <=
        local_a8._vars.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
        super__Vector_impl_data._M_start) break;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_88,
               (value_type_conflict2 *)&local_a8);
    local_a8._vars.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)((long)&(local_a8._vars.
                           super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                           super__Vector_impl_data._M_start)->_label + 1);
  }
  for (sVar5 = 0; sVar5 != maxiter; sVar5 = sVar5 + 1) {
    for (uVar4 = 0; uVar4 < (ulong)((long)ppVar3 - (long)ppVar2 >> 4); uVar4 = uVar4 + 1) {
      calcNewBox(this,fg,uVar4);
      ppVar2 = (fg->_fg)._E12.
               super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      ppVar3 = (fg->_fg)._E12.
               super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    }
  }
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&local_88);
  return;
}

Assistant:

void BoxBP::run( const FactorGraph &fg, size_t maxiter ) {
        _boxes.clear();
        _boxes.reserve( fg.nrEdges() );
        for( size_t iI = 0; iI < fg.nrEdges(); iI++ ) {
            size_t i = fg.edge(iI).first;
            _boxes.push_back( Box( fg.var(i) ) );
        }
        
        vector<size_t> edge_seq;
        edge_seq.reserve( fg.nrEdges() );
        for( size_t e = 0; e < fg.nrEdges(); e++ )
            edge_seq.push_back( e );

        for( size_t iter = 0; iter < maxiter; iter++ ) {
            for( size_t t = 0; t < fg.nrEdges(); t++ )
                calcNewBox(fg, t);
        }
    }